

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparison_TestShell::createTest
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparison_TestShell *this)

{
  TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test *this_00;
  TEST_MockExpectedCall_callWithObjectParameterEqualComparison_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x176);
  TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test::
  TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparison)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);

    call->withParameterOfType("type", "name", &type);
    CHECK(call->hasInputParameter(parameter));
}